

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FlattenLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_flatten(NeuralNetworkLayer *this)

{
  FlattenLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x12d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x12d;
    this_00 = (FlattenLayerParams *)operator_new(0x18);
    FlattenLayerParams::FlattenLayerParams(this_00);
    (this->layer_).flatten_ = this_00;
  }
  return (FlattenLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenLayerParams* NeuralNetworkLayer::mutable_flatten() {
  if (!has_flatten()) {
    clear_layer();
    set_has_flatten();
    layer_.flatten_ = new ::CoreML::Specification::FlattenLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.flatten)
  return layer_.flatten_;
}